

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

string * __thiscall
pbrt::LightBase::BaseToString_abi_cxx11_(string *__return_storage_ptr__,LightBase *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::LightType_const&,pbrt::MediumInterface_const&,pbrt::Transform_const&>
            (__return_storage_ptr__,"type: %s mediumInterface: %s renderFromLight: %s",&this->type,
             &this->mediumInterface,&this->renderFromLight);
  return __return_storage_ptr__;
}

Assistant:

std::string LightBase::BaseToString() const {
    return StringPrintf("type: %s mediumInterface: %s renderFromLight: %s", type,
                        mediumInterface, renderFromLight);
}